

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O0

void do_cmd_set_trap(loc_conflict grid)

{
  bool bVar1;
  chunk_conflict *c;
  byte bVar2;
  _Bool _Var3;
  trap_kind_conflict *ptVar4;
  wchar_t max_traps;
  loc_conflict grid_local;
  
  bVar1 = 0x18 < player->lev;
  bVar2 = bVar1 + 1;
  _Var3 = flag_has_dbg((player->state).pflags,10,0x4d,"player->state.pflags","(PF_EXTRA_TRAP)");
  if (_Var3) {
    bVar2 = bVar1 + 2;
  }
  if ((player->timed[2] != 0) || (_Var3 = no_light(player), c = cave, _Var3)) {
    msg("You can not see to set a trap.");
  }
  else if ((player->timed[4] == 0) && (player->timed[6] == 0)) {
    if (player->num_traps < bVar2) {
      ptVar4 = lookup_trap("basic trap");
      place_trap((chunk_conflict2 *)c,grid,ptVar4->tidx,L'\0');
      msg("You set a monster trap.");
    }
    else {
      msg("You must disarm an existing trap to free up your equipment.");
    }
  }
  else {
    msg("You are too confused.");
  }
  return;
}

Assistant:

static void do_cmd_set_trap(struct loc grid)
{
	int max_traps =	1 + ((player->lev >= 25) ? 1 : 0);

	/* Specialty ability Extra Trap */
	if (player_has(player, PF_EXTRA_TRAP)) max_traps++;

	if (player->timed[TMD_BLIND] || no_light(player)) {
		msg("You can not see to set a trap.");
		return;
	}

	if (player->timed[TMD_CONFUSED] || player->timed[TMD_IMAGE]) {
		msg("You are too confused.");
		return;
	}

	/* Forbid more than max_traps being set. */
	if (player->num_traps >= max_traps) {
		msg("You must disarm an existing trap to free up your equipment.");
		return;
	}

	/* Set the trap, and draw it. */
	place_trap(cave, grid, lookup_trap("basic trap")->tidx, 0);

	/* Notify the player. */
	msg("You set a monster trap.");
}